

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O2

uint32_t utrie2_get32FromLeadSurrogateCodeUnit_63(UTrie2 *trie,UChar32 c)

{
  uint32_t uVar1;
  
  if ((c & 0xfffffc00U) != 0xd800) {
    return trie->errorValue;
  }
  if (trie->data16 != (uint16_t *)0x0) {
    return (uint32_t)trie->index[(c & 0x1fU) + (uint)trie->index[(uint)c >> 5] * 4];
  }
  if (trie->data32 != (uint32_t *)0x0) {
    return trie->data32[(c & 0x1fU) + (uint)trie->index[(uint)c >> 5] * 4];
  }
  uVar1 = get32(trie->newTrie,c,'\0');
  return uVar1;
}

Assistant:

U_CAPI uint32_t U_EXPORT2
utrie2_get32FromLeadSurrogateCodeUnit(const UTrie2 *trie, UChar32 c) {
    if(!U_IS_LEAD(c)) {
        return trie->errorValue;
    }
    if(trie->data16!=NULL) {
        return UTRIE2_GET16_FROM_U16_SINGLE_LEAD(trie, c);
    } else if(trie->data32!=NULL) {
        return UTRIE2_GET32_FROM_U16_SINGLE_LEAD(trie, c);
    } else {
        return get32(trie->newTrie, c, FALSE);
    }
}